

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O0

size_t dropt_ssresize(dropt_stringstream *ss,size_t n)

{
  dropt_char *pdVar1;
  dropt_char *local_28;
  dropt_char *p;
  size_t n_local;
  dropt_stringstream *ss_local;
  
  if (ss == (dropt_stringstream *)0x0) {
    __assert_fail("ss != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x213,"size_t dropt_ssresize(dropt_stringstream *, size_t)");
  }
  p = (dropt_char *)n;
  if (n < ss->maxSize) {
    local_28 = (dropt_char *)n;
    if (n <= ss->used + 1) {
      local_28 = (dropt_char *)(ss->used + 1);
    }
    p = local_28;
  }
  if (p == (dropt_char *)0x0) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x219,"size_t dropt_ssresize(dropt_stringstream *, size_t)");
  }
  if ((p != (dropt_char *)ss->maxSize) &&
     (pdVar1 = (dropt_char *)dropt_safe_realloc(ss->string,(size_t)p,1), pdVar1 != (dropt_char *)0x0
     )) {
    ss->string = pdVar1;
    ss->maxSize = (size_t)p;
    if (ss->maxSize == 0) {
      __assert_fail("ss->maxSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                    ,0x222,"size_t dropt_ssresize(dropt_stringstream *, size_t)");
    }
  }
  return ss->maxSize;
}

Assistant:

static size_t
dropt_ssresize(dropt_stringstream* ss, size_t n)
{
    assert(ss != NULL);

    /* Don't allow shrinking if it will truncate the string. */
    if (n < ss->maxSize) { n = MAX(n, ss->used + 1 /* NUL */); }

    /* There should always be a buffer to point to. */
    assert(n > 0);

    if (n != ss->maxSize)
    {
        dropt_char* p = dropt_safe_realloc(ss->string, n, sizeof *ss->string);
        if (p != NULL)
        {
            ss->string = p;
            ss->maxSize = n;
            assert(ss->maxSize > 0);
         }
    }
    return ss->maxSize;
}